

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

double __thiscall
TxConfirmStats::EstimateMedianVal
          (TxConfirmStats *this,int confTarget,double sufficientTxVal,double successBreakPoint,
          uint nBlockHeight,EstimationResult *result)

{
  ConstevalFormatString<18U> fmt;
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  uint *puVar9;
  void *in_RCX;
  double *unaff_RBX;
  double *unaff_RBP;
  uint in_ESI;
  long in_RDI;
  double *unaff_R12;
  double *unaff_R13;
  float *unaff_R14;
  double *unaff_R15;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double in_XMM1_Qa;
  double *unaff_retaddr;
  double *in_stack_00000008;
  uint failMaxBucket_1;
  uint failMinBucket_1;
  uint j_1;
  uint j;
  uint maxBucket;
  uint minBucket;
  double txSum;
  uint failMaxBucket;
  uint failMinBucket;
  double curPct;
  uint confct;
  int bucket;
  bool passing;
  bool newBucketRange;
  uint bins;
  bool foundAnswer;
  double partialNum;
  int maxbucketindex;
  int periodTarget;
  double failNum;
  int extraNum;
  double totalNum;
  double nConf;
  float failed_within_target_perc;
  float passed_within_target_perc;
  double median;
  EstimatorBucket failBucket;
  EstimatorBucket passBucket;
  uint bestFarBucket;
  uint curFarBucket;
  uint bestNearBucket;
  uint curNearBucket;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  uint *in_stack_fffffffffffffd20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd38;
  value_type local_1f0;
  int *local_1e8;
  value_type local_1d8;
  uint in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  uint in_stack_fffffffffffffe50;
  uint uVar13;
  double dVar14;
  uint in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  uint local_184;
  int local_180;
  double local_170;
  double *local_160;
  int local_154;
  double *local_150;
  double *local_148;
  double local_e8;
  undefined1 local_e0 [48];
  value_type local_b0;
  value_type local_a8;
  double *local_a0;
  double *local_98;
  Level level;
  double in_stack_ffffffffffffff70;
  double *local_88;
  int *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  double *args_9;
  
  args_9 = *(double **)(in_FS_OFFSET + 0x28);
  local_148 = (double *)0x0;
  local_150 = (double *)0x0;
  local_154 = 0;
  local_160 = (double *)0x0;
  sVar6 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  local_180 = (int)sVar6 + -1;
  local_170 = 0.0;
  bVar2 = false;
  iVar15 = local_180;
  iVar16 = local_180;
  iVar17 = local_180;
  iVar18 = local_180;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  bVar3 = true;
  bVar1 = true;
  EstimatorBucket::EstimatorBucket
            ((EstimatorBucket *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  EstimatorBucket::EstimatorBucket
            ((EstimatorBucket *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  local_184 = in_ESI;
  for (; -1 < local_180; local_180 = local_180 + -1) {
    if (bVar3) {
      bVar3 = false;
      iVar18 = local_180;
    }
    iVar16 = local_180;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    pdVar10 = (double *)(*pvVar7 + (double)local_148);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    local_170 = *pvVar7 + local_170;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    pdVar11 = (double *)(*pvVar7 + (double)local_150);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    pdVar12 = (double *)(*pvVar7 + (double)local_160);
    uVar5 = local_184;
    for (; uVar4 = GetMaxConfirms((TxConfirmStats *)
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)),
        local_184 < uVar4; local_184 = local_184 + 1) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28,
                          (size_type)in_stack_fffffffffffffd20);
      local_154 = *pvVar8 + local_154;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28,
                        (size_type)in_stack_fffffffffffffd20);
    local_154 = *pvVar8 + local_154;
    local_160 = pdVar12;
    local_150 = pdVar11;
    local_148 = pdVar10;
    if (in_XMM0_Qa / (1.0 - *(double *)(in_RDI + 0x70)) <= local_170) {
      local_170 = 0.0;
      if (in_XMM1_Qa <= (double)pdVar10 / ((double)pdVar11 + (double)pdVar12 + (double)local_154)) {
        memset(local_e0,0,0x30);
        EstimatorBucket::EstimatorBucket
                  ((EstimatorBucket *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18))
        ;
        iVar15 = iVar16;
        iVar17 = iVar18;
        memcpy(&local_b0,local_e0,0x30);
        bVar2 = true;
        bVar1 = true;
        local_148 = (double *)0x0;
        local_150 = (double *)0x0;
        in_stack_ffffffffffffffa0 = (double *)(double)local_154;
        local_160 = (double *)0x0;
        local_154 = 0;
        bVar3 = true;
        in_stack_ffffffffffffff90 = pdVar10;
        in_stack_ffffffffffffff98 = pdVar11;
        in_stack_ffffffffffffffa8 = pdVar12;
        iVar16 = iVar15;
        iVar18 = iVar17;
      }
      else if (bVar1) {
        puVar9 = std::min<unsigned_int>
                           (in_stack_fffffffffffffd20,
                            (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        in_stack_fffffffffffffe6c = *puVar9;
        puVar9 = std::max<unsigned_int>
                           (in_stack_fffffffffffffd20,
                            (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        in_stack_fffffffffffffe68 = *puVar9;
        if (in_stack_fffffffffffffe6c == 0) {
          local_1d8 = 0.0;
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
          local_1d8 = *pvVar7;
        }
        local_b0 = local_1d8;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
        local_a8 = *pvVar7;
        in_stack_ffffffffffffff70 = (double)local_154;
        bVar1 = false;
        local_a0 = pdVar10;
        local_98 = pdVar11;
        local_88 = pdVar12;
      }
    }
    local_184 = uVar5;
  }
  local_e8 = -1.0;
  dVar14 = 0.0;
  puVar9 = std::min<unsigned_int>
                     (in_stack_fffffffffffffd20,
                      (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  uVar5 = *puVar9;
  puVar9 = std::max<unsigned_int>
                     (in_stack_fffffffffffffd20,
                      (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  uVar4 = *puVar9;
  uVar13 = uVar5;
  local_1e8 = in_stack_ffffffffffffff80;
  for (; level = SUB84(in_stack_ffffffffffffff70,0), uVar5 <= uVar4; uVar5 = uVar5 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    dVar14 = *pvVar7 + dVar14;
  }
  if ((bVar2) && ((dVar14 != 0.0 || (NAN(dVar14))))) {
    dVar14 = dVar14 / 2.0;
    for (in_stack_fffffffffffffe50 = uVar13; level = SUB84(in_stack_ffffffffffffff70,0),
        in_stack_fffffffffffffe50 <= uVar4;
        in_stack_fffffffffffffe50 = in_stack_fffffffffffffe50 + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
      level = SUB84(in_stack_ffffffffffffff70,0);
      if (dVar14 <= *pvVar7) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
        local_e8 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
        local_e8 = local_e8 / *pvVar7;
        break;
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
      dVar14 = dVar14 - *pvVar7;
    }
    if (uVar13 == 0) {
      local_1e8 = (int *)0x0;
    }
    else {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
      local_1e8 = (int *)*pvVar7;
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    in_stack_ffffffffffffff88 = (double *)*pvVar7;
  }
  if ((bVar1) && (!bVar3)) {
    puVar9 = std::min<unsigned_int>
                       (in_stack_fffffffffffffd20,
                        (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    in_stack_fffffffffffffe4c = *puVar9;
    puVar9 = std::max<unsigned_int>
                       (in_stack_fffffffffffffd20,
                        (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    in_stack_fffffffffffffe48 = *puVar9;
    if (in_stack_fffffffffffffe4c == 0) {
      local_1f0 = 0.0;
    }
    else {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
      local_1f0 = *pvVar7;
    }
    local_b0 = local_1f0;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
    local_a8 = *pvVar7;
    local_a0 = local_148;
    local_98 = local_150;
    level = SUB84((double)local_154,0);
    local_88 = local_160;
  }
  bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),Trace);
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    logging_function._M_str._0_4_ = in_stack_fffffffffffffe68;
    logging_function._M_len = (size_t)dVar14;
    logging_function._M_str._4_4_ = in_stack_fffffffffffffe6c;
    source_file._M_len._4_4_ = uVar5;
    source_file._M_len._0_4_ = in_stack_fffffffffffffe50;
    source_file._M_str._0_4_ = uVar4;
    source_file._M_str._4_4_ = uVar13;
    fmt.fmt._4_4_ = in_stack_fffffffffffffe4c;
    fmt.fmt._0_4_ = in_stack_fffffffffffffe48;
    LogPrintFormatInternal<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
              (logging_function,source_file,(int)((ulong)&local_88 >> 0x20),
               (LogFlags)&stack0xffffffffffffff98,level,fmt,local_1e8,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffffa8,(float *)CONCAT44(iVar15,in_stack_ffffffffffffffb0),
               (double *)CONCAT44(iVar17,iVar16),(double *)CONCAT44(local_184,iVar18),args_9,
               unaff_RBX,unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,
               in_stack_00000008);
  }
  if (in_RCX != (void *)0x0) {
    memcpy(in_RCX,&stack0xffffffffffffff80,0x30);
    memcpy((void *)((long)in_RCX + 0x30),&local_b0,0x30);
    *(undefined8 *)((long)in_RCX + 0x60) = *(undefined8 *)(in_RDI + 0x70);
    *(undefined4 *)((long)in_RCX + 0x68) = *(undefined4 *)(in_RDI + 0x78);
  }
  if (*(double **)(in_FS_OFFSET + 0x28) != args_9) {
    __stack_chk_fail();
  }
  return local_e8;
}

Assistant:

double TxConfirmStats::EstimateMedianVal(int confTarget, double sufficientTxVal,
                                         double successBreakPoint, unsigned int nBlockHeight,
                                         EstimationResult *result) const
{
    // Counters for a bucket (or range of buckets)
    double nConf = 0; // Number of tx's confirmed within the confTarget
    double totalNum = 0; // Total number of tx's that were ever confirmed
    int extraNum = 0;  // Number of tx's still in mempool for confTarget or longer
    double failNum = 0; // Number of tx's that were never confirmed but removed from the mempool after confTarget
    const int periodTarget = (confTarget + scale - 1) / scale;
    const int maxbucketindex = buckets.size() - 1;

    // We'll combine buckets until we have enough samples.
    // The near and far variables will define the range we've combined
    // The best variables are the last range we saw which still had a high
    // enough confirmation rate to count as success.
    // The cur variables are the current range we're counting.
    unsigned int curNearBucket = maxbucketindex;
    unsigned int bestNearBucket = maxbucketindex;
    unsigned int curFarBucket = maxbucketindex;
    unsigned int bestFarBucket = maxbucketindex;

    // We'll always group buckets into sets that meet sufficientTxVal --
    // this ensures that we're using consistent groups between different
    // confirmation targets.
    double partialNum = 0;

    bool foundAnswer = false;
    unsigned int bins = unconfTxs.size();
    bool newBucketRange = true;
    bool passing = true;
    EstimatorBucket passBucket;
    EstimatorBucket failBucket;

    // Start counting from highest feerate transactions
    for (int bucket = maxbucketindex; bucket >= 0; --bucket) {
        if (newBucketRange) {
            curNearBucket = bucket;
            newBucketRange = false;
        }
        curFarBucket = bucket;
        nConf += confAvg[periodTarget - 1][bucket];
        partialNum += txCtAvg[bucket];
        totalNum += txCtAvg[bucket];
        failNum += failAvg[periodTarget - 1][bucket];
        for (unsigned int confct = confTarget; confct < GetMaxConfirms(); confct++)
            extraNum += unconfTxs[(nBlockHeight - confct) % bins][bucket];
        extraNum += oldUnconfTxs[bucket];
        // If we have enough transaction data points in this range of buckets,
        // we can test for success
        // (Only count the confirmed data points, so that each confirmation count
        // will be looking at the same amount of data and same bucket breaks)

        if (partialNum < sufficientTxVal / (1 - decay)) {
            // the buckets we've added in this round aren't sufficient
            // so keep adding
            continue;
        } else {
            partialNum = 0; // reset for the next range we'll add

            double curPct = nConf / (totalNum + failNum + extraNum);

            // Check to see if we are no longer getting confirmed at the success rate
            if (curPct < successBreakPoint) {
                if (passing == true) {
                    // First time we hit a failure record the failed bucket
                    unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
                    unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
                    failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
                    failBucket.end = buckets[failMaxBucket];
                    failBucket.withinTarget = nConf;
                    failBucket.totalConfirmed = totalNum;
                    failBucket.inMempool = extraNum;
                    failBucket.leftMempool = failNum;
                    passing = false;
                }
                continue;
            }
            // Otherwise update the cumulative stats, and the bucket variables
            // and reset the counters
            else {
                failBucket = EstimatorBucket(); // Reset any failed bucket, currently passing
                foundAnswer = true;
                passing = true;
                passBucket.withinTarget = nConf;
                nConf = 0;
                passBucket.totalConfirmed = totalNum;
                totalNum = 0;
                passBucket.inMempool = extraNum;
                passBucket.leftMempool = failNum;
                failNum = 0;
                extraNum = 0;
                bestNearBucket = curNearBucket;
                bestFarBucket = curFarBucket;
                newBucketRange = true;
            }
        }
    }

    double median = -1;
    double txSum = 0;

    // Calculate the "average" feerate of the best bucket range that met success conditions
    // Find the bucket with the median transaction and then report the average feerate from that bucket
    // This is a compromise between finding the median which we can't since we don't save all tx's
    // and reporting the average which is less accurate
    unsigned int minBucket = std::min(bestNearBucket, bestFarBucket);
    unsigned int maxBucket = std::max(bestNearBucket, bestFarBucket);
    for (unsigned int j = minBucket; j <= maxBucket; j++) {
        txSum += txCtAvg[j];
    }
    if (foundAnswer && txSum != 0) {
        txSum = txSum / 2;
        for (unsigned int j = minBucket; j <= maxBucket; j++) {
            if (txCtAvg[j] < txSum)
                txSum -= txCtAvg[j];
            else { // we're in the right bucket
                median = m_feerate_avg[j] / txCtAvg[j];
                break;
            }
        }

        passBucket.start = minBucket ? buckets[minBucket-1] : 0;
        passBucket.end = buckets[maxBucket];
    }

    // If we were passing until we reached last few buckets with insufficient data, then report those as failed
    if (passing && !newBucketRange) {
        unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
        unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
        failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
        failBucket.end = buckets[failMaxBucket];
        failBucket.withinTarget = nConf;
        failBucket.totalConfirmed = totalNum;
        failBucket.inMempool = extraNum;
        failBucket.leftMempool = failNum;
    }

    float passed_within_target_perc = 0.0;
    float failed_within_target_perc = 0.0;
    if ((passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool)) {
        passed_within_target_perc = 100 * passBucket.withinTarget / (passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool);
    }
    if ((failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool)) {
        failed_within_target_perc = 100 * failBucket.withinTarget / (failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool);
    }

    LogDebug(BCLog::ESTIMATEFEE, "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n",
             confTarget, 100.0 * successBreakPoint, decay,
             median, passBucket.start, passBucket.end,
             passed_within_target_perc,
             passBucket.withinTarget, passBucket.totalConfirmed, passBucket.inMempool, passBucket.leftMempool,
             failBucket.start, failBucket.end,
             failed_within_target_perc,
             failBucket.withinTarget, failBucket.totalConfirmed, failBucket.inMempool, failBucket.leftMempool);


    if (result) {
        result->pass = passBucket;
        result->fail = failBucket;
        result->decay = decay;
        result->scale = scale;
    }
    return median;
}